

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall GEO::geofile::scale_data(geofile *this,double factor)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  bool local_29;
  double local_28;
  double local_18;
  double dStack_10;
  
  local_29 = true;
  local_28 = factor;
  make_coherent(this,&local_29);
  simplify_data(this);
  p_Var1 = (this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->points_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    local_18 = local_28;
    dStack_10 = local_28;
    do {
      p_Var1[1]._M_parent = (_Base_ptr)((double)p_Var1[1]._M_parent * local_18);
      p_Var1[1]._M_left = (_Base_ptr)((double)p_Var1[1]._M_left * dStack_10);
      p_Var1[1]._M_right = (_Base_ptr)((double)p_Var1[1]._M_right * local_28);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return 0;
}

Assistant:

int GEO::geofile::scale_data(const double factor)
{
    make_coherent(true);
    simplify_data();
    auto pm_end = points_map.end();
    for (auto i = points_map.begin(); i != pm_end; i++)
    {
        scale_point(i->second, factor);
    }
    return EXIT_SUCCESS;
}